

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_deserialize_map_element
          (t_cpp_generator *this,ostream *out,t_map *tmap,string *prefix)

{
  t_type *ptVar1;
  ostream *poVar2;
  string key;
  string val;
  t_field fkey;
  t_field fval;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  t_field local_188;
  t_field local_d8;
  
  std::__cxx11::string::string((string *)&local_1a8,"_key",(allocator *)&local_188);
  t_generator::tmp(&local_2c8,(t_generator *)this,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string((string *)&local_1e8,"_val",(allocator *)&local_188);
  t_generator::tmp(&local_1c8,(t_generator *)this,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  ptVar1 = tmap->key_type_;
  std::__cxx11::string::string((string *)&local_208,(string *)&local_2c8);
  t_field::t_field(&local_188,ptVar1,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  ptVar1 = tmap->val_type_;
  std::__cxx11::string::string((string *)&local_228,(string *)&local_1c8);
  t_field::t_field(&local_d8,ptVar1,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  t_generator::indent_abi_cxx11_(&local_308,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&local_308);
  declare_field_abi_cxx11_(&local_2e8,this,&local_188,false,false,false,false);
  poVar2 = std::operator<<(poVar2,(string *)&local_2e8);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::string((string *)&local_248,"",(allocator *)&local_308);
  std::__cxx11::string::string((string *)&local_268,"",(allocator *)&local_2e8);
  generate_deserialize_field(this,out,&local_188,&local_248,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  poVar2 = t_generator::indent((t_generator *)this,out);
  declare_field_abi_cxx11_(&local_308,this,&local_d8,false,false,false,true);
  poVar2 = std::operator<<(poVar2,(string *)&local_308);
  poVar2 = std::operator<<(poVar2," = ");
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,"[");
  poVar2 = std::operator<<(poVar2,(string *)&local_2c8);
  poVar2 = std::operator<<(poVar2,"];");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::string((string *)&local_288,"",(allocator *)&local_308);
  std::__cxx11::string::string((string *)&local_2a8,"",(allocator *)&local_2e8);
  generate_deserialize_field(this,out,&local_d8,&local_288,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  t_field::~t_field(&local_d8);
  t_field::~t_field(&local_188);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  return;
}

Assistant:

void t_cpp_generator::generate_deserialize_map_element(ostream& out, t_map* tmap, string prefix) {
  string key = tmp("_key");
  string val = tmp("_val");
  t_field fkey(tmap->get_key_type(), key);
  t_field fval(tmap->get_val_type(), val);

  out << indent() << declare_field(&fkey) << endl;

  generate_deserialize_field(out, &fkey);
  indent(out) << declare_field(&fval, false, false, false, true) << " = " << prefix << "[" << key
              << "];" << endl;

  generate_deserialize_field(out, &fval);
}